

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es.c
# Opt level: O3

int esMain(int argc,char **argv)

{
  int iVar1;
  bool_t bVar2;
  u32 uVar3;
  err_t eVar4;
  err_t eVar5;
  size_t sVar6;
  char *pcVar7;
  file_t file;
  tm_ticks_t tVar8;
  tm_ticks_t tVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char source [6];
  octet buf [2048];
  char local_866 [6];
  size_t local_860;
  size_t local_858;
  file_t local_850;
  ulong local_848;
  ulong local_840;
  size_t local_838 [257];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  es print\n    list available entropy sources and determine their health\n  es read <source> <count> <file>\n    read <count> Kbytes from <source> and store them in <file>\n  <source> in {trng, trng2, sys, sys2, timer, timerNN}\n    timerNNN -- use NNN sleep delays to produce one output bit\n"
           ,"es","monitor entropy sources");
    return -1;
  }
  iVar1 = strCmp(argv[1],"print");
  if (iVar1 == 0) {
    eVar5 = 0x25b;
    if (argc == 2) {
      printf("Sources:");
      lVar10 = 0;
      lVar12 = 0;
      do {
        pcVar7 = *(char **)((long)&PTR_anon_var_dwarf_4b55_0014e890 + lVar10);
        eVar5 = rngESRead(local_838,(void *)0x0,0,pcVar7);
        if (eVar5 == 0) {
          eVar5 = rngESTest(pcVar7);
          printf(" %s%c",pcVar7,(ulong)((uint)(eVar5 != 0) * 2 + 0x2b));
          lVar12 = lVar12 + 1;
        }
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x28);
      pcVar7 = "\n";
      if (lVar12 == 0) {
        pcVar7 = " none\n";
      }
      eVar5 = 0;
      printf(pcVar7);
      eVar4 = rngESHealth();
      printf("Health (at least two healthy sources): %c\n",(ulong)((uint)(eVar4 != 0) * 2 + 0x2b));
      eVar4 = rngESHealth2();
      printf("Health2 (there is a healthy physical source): %c\n",
             (ulong)((uint)(eVar4 != 0) * 2 + 0x2b));
      puts("\\warning health is volatile");
    }
    goto LAB_0010b138;
  }
  iVar1 = strCmp(argv[1],"read");
  eVar5 = 0x259;
  if (iVar1 != 0) goto LAB_0010b13c;
  eVar5 = 0x25b;
  if (argc != 5) goto LAB_0010b138;
  iVar1 = strCmp(argv[2],"trng");
  if (iVar1 == 0) {
    pcVar7 = "trng";
LAB_0010b195:
    strCopy(local_866,pcVar7);
    uVar11 = 0;
LAB_0010b1a2:
    bVar2 = decIsValid(argv[3]);
    if (((bVar2 != 0) && (sVar6 = strLen(argv[3]), sVar6 != 0)) &&
       ((sVar6 = strLen(argv[3]), sVar6 < 5 && (sVar6 = decCLZ(argv[3]), sVar6 == 0)))) {
      uVar3 = decToU32(argv[3]);
      eVar5 = cmdFileValNotExist(1,argv + 4);
      if (eVar5 == 0) {
        file = fileOpen(argv[4],"wb");
        if (file == (file_t)0x0) {
          eVar5 = 0xcb;
        }
        else {
          if (uVar3 != 0) {
            uVar13 = (ulong)uVar3 << 10;
            local_850 = file;
            local_840 = uVar11;
            do {
              local_860 = 0x800;
              if (uVar13 < 0x800) {
                local_860 = uVar13;
              }
              iVar1 = strCmp(local_866,"trng");
              if (((iVar1 == 0) || (iVar1 = strCmp(local_866,"trng2"), iVar1 == 0)) ||
                 ((iVar1 = strCmp(local_866,"sys"), iVar1 == 0 ||
                  ((iVar1 = strCmp(local_866,"timer"), uVar11 == 0 && (iVar1 == 0)))))) {
                sVar6 = local_860;
                eVar5 = rngESRead(&local_858,local_838,local_860,local_866);
                if (eVar5 == 0) {
                  if (local_858 == sVar6) goto LAB_0010b2da;
                  eVar5 = 0xcf;
                }
LAB_0010b3c4:
                fileClose(file);
                goto LAB_0010b138;
              }
              sVar6 = 0;
              local_848 = uVar13;
              do {
                *(undefined1 *)((long)local_838 + sVar6) = 0;
                tVar8 = tmTicks();
                lVar10 = 0;
                do {
                  uVar13 = 0;
                  for (; uVar11 != 0; uVar11 = uVar11 - 1) {
                    mtSleep(0);
                    tVar9 = tmTicks();
                    uVar13 = uVar13 ^ tVar9 - tVar8;
                    tVar8 = tVar9;
                  }
                  bVar2 = u64Parity(uVar13);
                  *(byte *)((long)local_838 + sVar6) =
                       *(byte *)((long)local_838 + sVar6) ^ (byte)(bVar2 << ((byte)lVar10 & 0x1f));
                  lVar10 = lVar10 + 1;
                  uVar11 = local_840;
                } while (lVar10 != 8);
                sVar6 = sVar6 + 1;
              } while (sVar6 != local_860);
              local_858 = local_860;
              sVar6 = local_860;
              file = local_850;
              uVar13 = local_848;
LAB_0010b2da:
              sVar6 = fileWrite2(file,local_838,sVar6);
              if (sVar6 != local_858) {
                eVar5 = 0xce;
                goto LAB_0010b3c4;
              }
              uVar13 = uVar13 - sVar6;
            } while (uVar13 != 0);
          }
          bVar2 = fileClose(file);
          eVar5 = 0x67;
          if (bVar2 != 0) {
            eVar5 = 0;
          }
        }
      }
    }
  }
  else {
    iVar1 = strCmp(argv[2],"trng2");
    if (iVar1 == 0) {
      pcVar7 = "trng2";
      goto LAB_0010b195;
    }
    iVar1 = strCmp(argv[2],"sys");
    if (iVar1 == 0) {
      pcVar7 = "sys";
      goto LAB_0010b195;
    }
    iVar1 = strCmp(argv[2],"timer");
    if (iVar1 == 0) {
      pcVar7 = "timer";
      goto LAB_0010b195;
    }
    bVar2 = strStartsWith(argv[2],"timer");
    if (bVar2 != 0) {
      strCopy(local_866,"timer");
      sVar6 = strLen("timer");
      pcVar7 = argv[2];
      argv[2] = pcVar7 + sVar6;
      bVar2 = decIsValid(pcVar7 + sVar6);
      if ((((bVar2 == 0) || (sVar6 = strLen(argv[2]), sVar6 == 0)) ||
          (sVar6 = strLen(argv[2]), 3 < sVar6)) || (sVar6 = decCLZ(argv[2]), sVar6 != 0))
      goto LAB_0010b138;
      uVar3 = decToU32(argv[2]);
      uVar11 = (ulong)uVar3;
      goto LAB_0010b1a2;
    }
  }
LAB_0010b138:
  if (eVar5 == 0) {
    return 0;
  }
LAB_0010b13c:
  pcVar7 = errMsg(eVar5);
  printf("bee2cmd/%s: %s\n","es",pcVar7);
  return eVar5;
}

Assistant:

int esMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return esUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "print"))
		code = esPrint(argc - 1, argv + 1);
	else if (strEq(argv[0], "read"))
		code = esRead(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return (int)code;
}